

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

void __thiscall Logger::logBreak(Logger *this)

{
  ostream *poVar1;
  
  (this->mLastLog)._M_string_length = 0;
  *(this->mLastLog)._M_dataplus._M_p = '\0';
  std::__cxx11::string::resize((ulong)&this->mLastLog,'\0');
  std::__cxx11::string::_M_replace_aux
            ((ulong)&this->mLastLog,0,(this->mLastLog)._M_string_length,-3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this,(this->mLastLog)._M_dataplus._M_p,
                      (this->mLastLog)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Logger::logBreak() {
    mLastLog.clear();
    mLastLog.resize(256);
    mLastLog.assign(253, '-');
    mLogStream << mLastLog << std::endl;
}